

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashlist.c
# Opt level: O2

ktx_error_code_e ktxHashList_CreateCopy(ktxHashList **ppHl,ktxHashList orig)

{
  ktx_error_code_e kVar1;
  ktxHashList *pHead;
  
  pHead = (ktxHashList *)malloc(8);
  if (pHead == (ktxHashList *)0x0) {
    kVar1 = KTX_OUT_OF_MEMORY;
  }
  else {
    ktxHashList_ConstructCopy(pHead,orig);
    *ppHl = pHead;
    kVar1 = KTX_SUCCESS;
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxHashList_CreateCopy(ktxHashList** ppHl, ktxHashList orig)
{
    ktxHashList* hl = (ktxHashList*)malloc(sizeof (ktxKVListEntry*));
    if (hl == NULL)
        return KTX_OUT_OF_MEMORY;

    ktxHashList_ConstructCopy(hl, orig);
    *ppHl = hl;
    return KTX_SUCCESS;
}